

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

int link_set_attach_properties(LINK_HANDLE link,fields attach_properties)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x46a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x46a;
    }
    pcVar5 = "NULL link";
    iVar3 = 0x469;
  }
  else {
    pAVar1 = amqpvalue_clone(attach_properties);
    link->attach_properties = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x472;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x472;
    }
    pcVar5 = "Failed cloning attach properties";
    iVar3 = 0x471;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
            "link_set_attach_properties",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int link_set_attach_properties(LINK_HANDLE link, fields attach_properties)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        link->attach_properties = amqpvalue_clone(attach_properties);
        if (link->attach_properties == NULL)
        {
            LogError("Failed cloning attach properties");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}